

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O2

shared_ptr<peg::Ope>
peg::seq<peg::Definition&,peg::Definition&,peg::Definition&,std::shared_ptr<peg::Ope>>
          (Definition *args,Definition *args_1,Definition *args_2,shared_ptr<peg::Ope> *args_3)

{
  undefined8 uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2> *in_R8;
  shared_ptr<peg::Ope> sVar2;
  undefined1 auStack_78 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 local_58 [32];
  undefined1 local_38 [24];
  
  Definition::operator_cast_to_shared_ptr((Definition *)local_58);
  Definition::operator_cast_to_shared_ptr((Definition *)(auStack_78 + 0x10));
  Definition::operator_cast_to_shared_ptr((Definition *)auStack_78);
  std::__shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x10),in_R8);
  std::
  make_shared<peg::Sequence,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>>
            ((shared_ptr<peg::Ope> *)local_38,(shared_ptr<peg::Ope> *)local_58,
             (shared_ptr<peg::Ope> *)(auStack_78 + 0x10),(shared_ptr<peg::Ope> *)auStack_78);
  uVar1 = local_38._8_8_;
  local_38._8_8_ = (void *)0x0;
  (args->name)._M_dataplus._M_p = (pointer)local_38._0_8_;
  (args->name)._M_string_length = uVar1;
  local_38._0_8_ = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_78 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  sVar2.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)args;
  return (shared_ptr<peg::Ope>)sVar2.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Ope> seq(Args&& ...args) {
    return std::make_shared<Sequence>(static_cast<std::shared_ptr<Ope>>(args)...);
}